

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitAtomicWait(I64ToI32Lowering *this,AtomicWait *curr)

{
  initializer_list<wasm::Expression_*> __l;
  IString str;
  Index index;
  pointer this_00;
  pointer pBVar1;
  address64_t aVar2;
  Call *expression;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_01;
  Type local_c8;
  allocator<wasm::Expression_*> local_bd [13];
  Type local_b0;
  TempVar local_a8;
  Const *local_88;
  Expression *local_80;
  Expression *local_78;
  Expression *local_70;
  LocalGet *local_68;
  Const **local_60;
  size_type local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  size_t local_38;
  char *pcStack_30;
  string_view local_28;
  AtomicWait *local_18;
  AtomicWait *curr_local;
  I64ToI32Lowering *this_local;
  
  this_01 = &this->builder;
  local_18 = curr;
  curr_local = (AtomicWait *)this;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_01)
  ;
  local_38 = ABI::wasm2js::ATOMIC_WAIT_I32;
  pcStack_30 = DAT_03192e68;
  str.str._M_str = DAT_03192e68;
  str.str._M_len = ABI::wasm2js::ATOMIC_WAIT_I32;
  wasm::Name::Name((Name *)&local_28,str);
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_01);
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&local_18->offset);
  local_88 = Builder::makeConst<int>(pBVar1,(int)aVar2);
  local_80 = local_18->ptr;
  local_78 = local_18->expected;
  local_70 = local_18->timeout;
  pBVar1 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_01);
  fetchOutParam(&local_a8,this,local_18->timeout);
  index = TempVar::operator_cast_to_unsigned_int(&local_a8);
  wasm::Type::Type(&local_b0,i32);
  local_68 = Builder::makeLocalGet(pBVar1,index,local_b0);
  local_60 = &local_88;
  local_58 = 5;
  std::allocator<wasm::Expression_*>::allocator(local_bd);
  __l._M_len = local_58;
  __l._M_array = (iterator)local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_50,__l,local_bd);
  wasm::Type::Type(&local_c8,i32);
  expression = Builder::makeCall(this_00,(Name)local_28,&local_50,local_c8,false);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_50);
  std::allocator<wasm::Expression_*>::~allocator(local_bd);
  TempVar::~TempVar(&local_a8);
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    // The last parameter is an i64, so we cannot leave it as it is
    replaceCurrent(builder->makeCall(
      ABI::wasm2js::ATOMIC_WAIT_I32,
      {builder->makeConst(int32_t(curr->offset)),
       curr->ptr,
       curr->expected,
       curr->timeout,
       builder->makeLocalGet(fetchOutParam(curr->timeout), Type::i32)},
      Type::i32));
  }